

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void stb_readdir_free(char **files)

{
  int local_24;
  int local_1c;
  char **ppcStack_18;
  int i;
  char **f2;
  char **files_local;
  
  local_1c = 0;
  ppcStack_18 = files;
  f2 = files;
  while( true ) {
    if (ppcStack_18 == (char **)0x0) {
      local_24 = 0;
    }
    else {
      local_24 = *(int *)(ppcStack_18 + -2);
    }
    if (local_24 <= local_1c) break;
    free(ppcStack_18[local_1c]);
    local_1c = local_1c + 1;
  }
  stb_arr_free_(&stack0xffffffffffffffe8);
  return;
}

Assistant:

void stb_readdir_free(char **files)
{
   char **f2 = files;
   int i;
   for (i=0; i < stb_arr_len(f2); ++i)
      free(f2[i]);
   stb_arr_free(f2);
}